

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkaccessmanager.cpp
# Opt level: O0

QThread * __thiscall QNetworkAccessManagerPrivate::createThread(QNetworkAccessManagerPrivate *this)

{
  QArrayDataPointer<char16_t> *this_00;
  long in_RDI;
  long in_FS_OFFSET;
  char16_t *str;
  DataPointer *in_stack_ffffffffffffff88;
  QArrayDataPointer<char16_t> local_38 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)(in_RDI + 0x88) == 0) {
    this_00 = (QArrayDataPointer<char16_t> *)operator_new(0x10);
    QThread::QThread((QThread *)this_00,(QObject *)0x0);
    *(QArrayDataPointer<char16_t> **)(in_RDI + 0x88) = this_00;
    QArrayDataPointer<char16_t>::QArrayDataPointer
              (local_38,(Data *)0x0,L"QNetworkAccessManager thread",0x1c);
    QString::QString((QString *)this_00,in_stack_ffffffffffffff88);
    QObject::setObjectName<void>((QObject *)this_00,(QString *)in_stack_ffffffffffffff88);
    QString::~QString((QString *)0x19f79b);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(this_00);
    QThread::start(*(undefined8 *)(in_RDI + 0x88),7);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return *(QThread **)(in_RDI + 0x88);
  }
  __stack_chk_fail();
}

Assistant:

QThread * QNetworkAccessManagerPrivate::createThread()
{
    if (!thread) {
        thread = new QThread;
        thread->setObjectName(QStringLiteral("QNetworkAccessManager thread"));
        thread->start();
    }
    Q_ASSERT(thread);
    return thread;
}